

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

block_state deflate_fast(deflate_state *s,int flush)

{
  ushort uVar1;
  uInt uVar2;
  uInt uVar3;
  uInt uVar4;
  Posf *pPVar5;
  Posf *pPVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Bytef *pBVar14;
  uInt uVar15;
  uInt uVar16;
  IPos cur_match;
  bool bVar17;
  
  cur_match = 0;
LAB_00521f9e:
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      uVar9 = s->lookahead;
      if (flush == 0 && uVar9 < 0x106) {
        return need_more;
      }
      if (uVar9 == 0) {
        uVar10 = s->block_start;
        if ((long)uVar10 < 0) {
          pBVar14 = (Bytef *)0x0;
        }
        else {
          pBVar14 = s->window + (uVar10 & 0xffffffff);
        }
        cm_zlib__tr_flush_block(s,(charf *)pBVar14,s->strstart - uVar10,(uint)(flush == 4));
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out != 0) {
          return (uint)(flush == 4) * 2 + block_done;
        }
        return (uint)(flush == 4) * 2;
      }
      if (2 < uVar9) goto LAB_00521fde;
    }
    else {
LAB_00521fde:
      uVar9 = s->strstart;
      uVar13 = ((uint)s->window[uVar9 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) &
               s->hash_mask;
      s->ins_h = uVar13;
      pPVar5 = s->head;
      uVar1 = pPVar5[uVar13];
      cur_match = (IPos)uVar1;
      s->prev[s->w_mask & uVar9] = uVar1;
      pPVar5[uVar13] = (Posf)uVar9;
    }
    if ((cur_match == 0) || (uVar9 = s->strstart - cur_match, s->w_size - 0x106 < uVar9)) {
LAB_00522041:
      uVar9 = s->match_length;
    }
    else {
      if ((s->strategy & 0xfffffffeU) == 2) {
        if (uVar9 != 1 || s->strategy != 3) goto LAB_00522041;
        uVar9 = longest_match_fast(s,cur_match);
      }
      else {
        uVar9 = longest_match(s,cur_match);
      }
      s->match_length = uVar9;
    }
    if (uVar9 < 3) {
      bVar8 = s->window[s->strstart];
      uVar9 = s->last_lit;
      s->d_buf[uVar9] = 0;
      s->last_lit = uVar9 + 1;
      s->l_buf[uVar9] = bVar8;
      s->dyn_ltree[bVar8].fc.freq = s->dyn_ltree[bVar8].fc.freq + 1;
      s->lookahead = s->lookahead - 1;
      uVar9 = s->strstart + 1;
      uVar10 = (ulong)uVar9;
      s->strstart = uVar9;
      if (s->last_lit != s->lit_bufsize - 1) goto LAB_00521f9e;
    }
    else {
      bVar8 = (char)uVar9 - 3;
      iVar11 = s->strstart - s->match_start;
      uVar9 = s->last_lit;
      s->d_buf[uVar9] = (ushf)iVar11;
      s->last_lit = uVar9 + 1;
      s->l_buf[uVar9] = bVar8;
      uVar12 = iVar11 - 1;
      s->dyn_ltree[(ulong)""[bVar8] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar8] + 0x101].fc.freq + 1;
      uVar13 = uVar12 & 0xffff;
      uVar9 = (uVar13 >> 7) + 0x100;
      if (uVar13 < 0x100) {
        uVar9 = uVar12;
      }
      s->dyn_dtree[""[uVar9 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar9 & 0xffff]].fc.freq + 1;
      uVar2 = s->last_lit;
      uVar3 = s->lit_bufsize;
      uVar9 = s->match_length;
      uVar13 = s->lookahead - uVar9;
      s->lookahead = uVar13;
      if (uVar13 < 3 || s->max_lazy_match < uVar9) {
        uVar4 = s->strstart;
        uVar13 = uVar4 + uVar9;
        uVar10 = (ulong)uVar13;
        s->strstart = uVar13;
        s->match_length = 0;
        uVar13 = (uint)s->window[uVar10];
        s->ins_h = uVar13;
        s->ins_h = ((uint)s->window[uVar4 + uVar9 + 1] ^ uVar13 << ((byte)s->hash_shift & 0x1f)) &
                   s->hash_mask;
      }
      else {
        s->match_length = uVar9 - 1;
        uVar4 = s->hash_shift;
        pBVar14 = s->window;
        uVar13 = s->hash_mask;
        pPVar5 = s->head;
        pPVar6 = s->prev;
        uVar12 = s->w_mask;
        uVar16 = s->ins_h;
        uVar15 = uVar9 - 2;
        uVar10 = (ulong)(s->strstart + 1);
        do {
          uVar9 = (uint)uVar10;
          s->strstart = uVar9;
          uVar16 = ((uint)pBVar14[uVar9 + 2] ^ uVar16 << ((byte)uVar4 & 0x1f)) & uVar13;
          s->ins_h = uVar16;
          uVar1 = pPVar5[uVar16];
          cur_match = (IPos)uVar1;
          pPVar6[uVar12 & uVar9] = uVar1;
          pPVar5[uVar16] = (Posf)uVar10;
          s->match_length = uVar15;
          uVar10 = (ulong)(uVar9 + 1);
          bVar17 = uVar15 != 0;
          uVar15 = uVar15 - 1;
        } while (bVar17);
        s->strstart = uVar9 + 1;
      }
      if (uVar2 != uVar3 - 1) goto LAB_00521f9e;
    }
    uVar7 = s->block_start;
    if ((long)uVar7 < 0) {
      pBVar14 = (Bytef *)0x0;
    }
    else {
      pBVar14 = s->window + (uVar7 & 0xffffffff);
    }
    cm_zlib__tr_flush_block(s,(charf *)pBVar14,uVar10 - uVar7,0);
    s->block_start = (ulong)s->strstart;
    flush_pending(s->strm);
    if (s->strm->avail_out == 0) {
      return need_more;
    }
  } while( true );
}

Assistant:

local block_state deflate_fast(s, flush)
    deflate_state *s;
    int flush;
{
    IPos hash_head = NIL; /* head of the hash chain */
    int bflush;           /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
#ifdef FASTEST
            if ((s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) ||
                (s->strategy == Z_RLE && s->strstart - hash_head == 1)) {
                s->match_length = longest_match_fast (s, hash_head);
            }
#else
            if (s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) {
                s->match_length = longest_match (s, hash_head);
            } else if (s->strategy == Z_RLE && s->strstart - hash_head == 1) {
                s->match_length = longest_match_fast (s, hash_head);
            }
#endif
            /* longest_match() or longest_match_fast() sets match_start */
        }
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->match_start, s->match_length);

            _tr_tally_dist(s, s->strstart - s->match_start,
                           s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
#ifndef FASTEST
            if (s->match_length <= s->max_insert_length &&
                s->lookahead >= MIN_MATCH) {
                s->match_length--; /* string at strstart already in table */
                do {
                    s->strstart++;
                    INSERT_STRING(s, s->strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
                } while (--s->match_length != 0);
                s->strstart++;
            } else
#endif
            {
                s->strstart += s->match_length;
                s->match_length = 0;
                s->ins_h = s->window[s->strstart];
                UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
                /* If lookahead < MIN_MATCH, ins_h is garbage, but it does not
                 * matter since it will be recomputed at next deflate call.
                 */
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit (s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}